

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int add_brand(JSParseState *s,ClassFieldsDef *cf)

{
  int iVar1;
  
  if (cf->has_brand != 0) {
    return 0;
  }
  if ((cf->fields_init_fd == (JSFunctionDef *)0x0) &&
     (iVar1 = emit_class_init_start(s,cf), iVar1 != 0)) {
    return -1;
  }
  (cf->fields_init_fd->byte_code).buf[cf->brand_push_pos] = '\n';
  cf->has_brand = 1;
  return 0;
}

Assistant:

static __exception int add_brand(JSParseState *s, ClassFieldsDef *cf)
{
    if (!cf->has_brand) {
        /* define the brand field in 'this' of the initializer */
        if (!cf->fields_init_fd) {
            if (emit_class_init_start(s, cf))
                return -1;
        }
        /* patch the start of the function to enable the OP_add_brand code */
        cf->fields_init_fd->byte_code.buf[cf->brand_push_pos] = OP_push_true;
        
        cf->has_brand = TRUE;
    }
    return 0;
}